

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

double __thiscall
Problem_CGBG_FF::Likelihood
          (Problem_CGBG_FF *this,Index houseI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oVec_hI,Index fireLevel)

{
  ulong __n;
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar2;
  Problem_CGBG_FF *unaff_retaddr;
  double p_this_obs;
  observation_t obs;
  Index i;
  double p;
  undefined4 local_2c;
  undefined8 local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  
  local_28 = 1.0;
  local_2c = 0;
  pvVar3 = in_RDI;
  while( true ) {
    __n = (ulong)local_2c;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    if (sVar1 <= __n) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(in_RDI,__n);
    dVar2 = FLObservationProb(unaff_retaddr,(Index)((ulong)pvVar3 >> 0x20),(observation_t)pvVar3);
    local_28 = dVar2 * local_28;
    local_2c = local_2c + 1;
  }
  return local_28;
}

Assistant:

double Problem_CGBG_FF::Likelihood(Index houseI, 
        const vector<Problem_CGBG_FF::observation_t>& oVec_hI, Index fireLevel) const
{
    double p = 1.0;
    for(Index i=0; i < oVec_hI.size(); i++)
    {
        Problem_CGBG_FF::observation_t obs = oVec_hI.at(i);
        double p_this_obs = FLObservationProb(fireLevel, obs);

        //cout << "Likelihood: P(obs|FL)="<<p_this_obs<<" for obs, " << obs <<", FL="<<fireLevel<<endl;
        p *= p_this_obs;
    }
    return p;
}